

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00e2.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  int i_1;
  istream *piVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  int j_1;
  long lVar6;
  long lVar7;
  int *piVar8;
  int i;
  int iVar9;
  int *piVar10;
  int j;
  long lVar11;
  undefined8 uStack_80;
  int aiStack_78 [2];
  long local_70;
  ulong local_68;
  int *local_60;
  undefined1 *local_58;
  int local_4c;
  int local_48;
  int r;
  int r1;
  int c1;
  int x;
  int y;
  int r2;
  int c2;
  
  uStack_80 = 0x1011e3;
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&r1);
  uStack_80 = 0x1011f2;
  std::istream::operator>>(piVar2,&c1);
  uStack_80 = 0x1011fe;
  std::istream::operator>>((istream *)&std::cin,&local_4c);
  local_68 = (ulong)(uint)c1;
  lVar1 = -((uint)r1 * local_68 * 4 + 0xf & 0xfffffffffffffff0);
  piVar8 = (int *)((long)aiStack_78 + lVar1);
  local_70 = local_68 * 4;
  local_60 = piVar8;
  local_58 = (undefined1 *)aiStack_78;
  for (lVar7 = 0; lVar11 = local_70, lVar7 < r1; lVar7 = lVar7 + 1) {
    piVar10 = piVar8;
    for (lVar11 = 0; lVar11 < c1; lVar11 = lVar11 + 1) {
      *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x10125b;
      std::istream::operator>>((istream *)&std::cin,piVar10);
      piVar10 = piVar10 + 1;
    }
    piVar8 = (int *)((long)piVar8 + local_70);
  }
  iVar9 = 0;
  do {
    if (local_4c <= iVar9) {
      return 0;
    }
    *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x10129c;
    piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_48);
    *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x1012a8;
    piVar2 = (istream *)std::istream::operator>>(piVar2,&r);
    *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x1012b3;
    piVar2 = (istream *)std::istream::operator>>(piVar2,&x);
    *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x1012be;
    std::istream::operator>>(piVar2,&y);
    if ((x < local_48) || (y < r)) {
      poVar5 = (ostream *)&std::cout;
      pcVar4 = "INVALID\n";
LAB_001012de:
      *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x1012e3;
      std::operator<<(poVar5,pcVar4);
    }
    else {
      if (r <= c1 && local_48 <= r1) {
        if (r1 < x) {
          x = r1;
        }
        if (c1 < y) {
          y = c1;
        }
        lVar7 = (long)local_48 + -1;
        iVar3 = local_60[lVar7 * local_68 + (long)r + -1];
        piVar8 = (int *)(lVar11 * lVar7 + (long)local_60);
        for (; lVar6 = (long)(r + -1), lVar7 < x; lVar7 = lVar7 + 1) {
          for (; lVar6 < y; lVar6 = lVar6 + 1) {
            if (iVar3 < piVar8[lVar6]) {
              iVar3 = piVar8[lVar6];
            }
          }
          piVar8 = (int *)((long)piVar8 + lVar11);
        }
        *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x10138c;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        pcVar4 = "\n";
        goto LAB_001012de;
      }
      *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x101314;
      poVar5 = std::operator<<((ostream *)&std::cout,"OUTSIDE");
      *(undefined8 *)((long)aiStack_78 + lVar1 + -8) = 0x10131c;
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

int main() {
    int x, y;
    cin >> x >> y;
    int r, r1, c1, r2, c2;
    cin >> r;
    int arr[x][y];
    for (int i = 0; i < x; i++) {
        for (int j = 0; j < y; j++) {
            cin >> arr[i][j];
        }
    }

    for (int i = 0; i < r; i++) {
        cin >> r1 >> c1 >> r2 >> c2;
        if (r1 > r2 || c1 > c2) {
            cout << "INVALID\n";
        } else if (r1 > x || c1 > y) {
            cout << "OUTSIDE" << endl;
        } else {
            if (r2 > x)
                r2 = x;
            if (c2 > y)
                c2 = y;
            int localmax = arr[r1 - 1][c1 - 1];
            for (int i = r1 - 1; i < r2; i++) {
                for (int j = c1 - 1; j < c2; j++) {
                    if (arr[i][j] > localmax) {
                        localmax = arr[i][j];
                    }
                }
            }
            cout << localmax << "\n";
        }
    }
}